

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalSequenceNoSideEffCase2(ShaderEvalContext *ctx)

{
  undefined8 uVar1;
  float fVar2;
  Vector<int,_2> local_30;
  Vector<float,_2> local_28;
  VecAccess<float,_4,_2> local_20;
  
  fVar2 = (float)(-(uint)(0.0 < ctx->in[0].m_data[2]) & 0x3f800000);
  uVar1 = *(undefined8 *)(ctx->in[2].m_data + 1);
  local_30.m_data[1] = (int)(fVar2 + (float)uVar1);
  local_30.m_data[0] = (int)(fVar2 + (float)((ulong)uVar1 >> 0x20));
  tcu::Vector<int,_2>::cast<float>(&local_30);
  local_20.m_vector = &ctx->color;
  local_20.m_index[0] = 1;
  local_20.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_20,&local_28);
  return;
}

Assistant:

void evalSequenceNoSideEffCase2	(ShaderEvalContext& ctx) { ctx.color.yz()	= sequenceNoSideEffCase2(ctx.in[0].z() > 0.0f, ctx.in[1].x() > 0.0f, ctx.in[2].swizzle(2, 1)).asFloat(); }